

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O0

void __thiscall QPDFJob::UnderOverlay::UnderOverlay(UnderOverlay *this,char *which)

{
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  char *local_18;
  char *which_local;
  UnderOverlay *this_local;
  
  local_18 = which;
  which_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,which,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->filename);
  std::shared_ptr<char>::shared_ptr(&this->password);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->to_nr,"1-z",local_2d);
  std::allocator<char>::~allocator(local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->from_nr,"1-z",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->repeat_nr,"",&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  std::unique_ptr<QPDF,std::default_delete<QPDF>>::unique_ptr<std::default_delete<QPDF>,void>
            ((unique_ptr<QPDF,std::default_delete<QPDF>> *)&this->pdf);
  std::vector<int,_std::allocator<int>_>::vector(&this->to_pagenos);
  std::vector<int,_std::allocator<int>_>::vector(&this->from_pagenos);
  std::vector<int,_std::allocator<int>_>::vector(&this->repeat_pagenos);
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }